

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalNinjaMultiGenerator::ConfigDirectory
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *config)

{
  ulong uVar1;
  allocator<char> local_81;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  string *local_20;
  string *config_local;
  cmGlobalNinjaMultiGenerator *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmGlobalNinjaMultiGenerator *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_50,'/');
    cmAlphaNum::cmAlphaNum(&local_80,local_20);
    cmStrCat<>(__return_storage_ptr__,&local_50,&local_80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConfigDirectory(const std::string& config) const override
  {
    if (!config.empty()) {
      return cmStrCat('/', config);
    }
    return "";
  }